

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_cwd(Curl_easy *data,connectdata *conn)

{
  ftp_conn *ftpc;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (((conn->proto).ftpc.cwddone & 1U) == 0) {
    (conn->proto).ftpc.count2 = 0;
    if ((((*(uint *)&(conn->bits).field_0x4 >> 7 & 1) == 0) ||
        ((conn->proto).ftpc.entrypath == (char *)0x0)) ||
       (((conn->proto).ftpc.dirdepth != 0 && (**(conn->proto).ftpc.dirs == '/')))) {
      if ((conn->proto).ftpc.dirdepth == 0) {
        ftpc._4_4_ = ftp_state_mdtm(data);
      }
      else {
        (conn->proto).ftpc.cwdcount = 1;
        ftpc._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"CWD %s",
                                   (conn->proto).ftpc.dirs[(conn->proto).ftpc.cwdcount + -1]);
        if (ftpc._4_4_ == CURLE_OK) {
          _state(data,FTP_CWD);
        }
      }
    }
    else {
      (conn->proto).ftpc.cwdcount = 0;
      ftpc._4_4_ = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"CWD %s",(conn->proto).ftpc.entrypath);
      if (ftpc._4_4_ == CURLE_OK) {
        _state(data,FTP_CWD);
      }
    }
  }
  else {
    ftpc._4_4_ = ftp_state_mdtm(data);
  }
  return ftpc._4_4_;
}

Assistant:

static CURLcode ftp_state_cwd(struct Curl_easy *data,
                              struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(ftpc->cwddone)
    /* already done and fine */
    result = ftp_state_mdtm(data);
  else {
    /* FTPFILE_NOCWD with full path: expect ftpc->cwddone! */
    DEBUGASSERT((data->set.ftp_filemethod != FTPFILE_NOCWD) ||
                !(ftpc->dirdepth && ftpc->dirs[0][0] == '/'));

    ftpc->count2 = 0; /* count2 counts failed CWDs */

    if(conn->bits.reuse && ftpc->entrypath &&
       /* no need to go to entrypath when we have an absolute path */
       !(ftpc->dirdepth && ftpc->dirs[0][0] == '/')) {
      /* This is a re-used connection. Since we change directory to where the
         transfer is taking place, we must first get back to the original dir
         where we ended up after login: */
      ftpc->cwdcount = 0; /* we count this as the first path, then we add one
                             for all upcoming ones in the ftp->dirs[] array */
      result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s", ftpc->entrypath);
      if(!result)
        state(data, FTP_CWD);
    }
    else {
      if(ftpc->dirdepth) {
        ftpc->cwdcount = 1;
        /* issue the first CWD, the rest is sent when the CWD responses are
           received... */
        result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                               ftpc->dirs[ftpc->cwdcount -1]);
        if(!result)
          state(data, FTP_CWD);
      }
      else {
        /* No CWD necessary */
        result = ftp_state_mdtm(data);
      }
    }
  }
  return result;
}